

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmChkCmp2<(moira::Instr)145,(moira::Mode)9,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  u32 ext_00;
  StrWriter *pSVar3;
  Av<(moira::Instr)145,_(moira::Mode)9,_4> local_68;
  int local_64;
  int local_5c;
  int local_54;
  int local_4c;
  Rn local_44;
  undefined1 local_40 [4];
  Rn dst;
  Ea<(moira::Mode)9,_4> src;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uVar1 = *addr;
  ext_00 = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)9,4>((Ea<(moira::Mode)9,_4> *)local_40,this,op & 7,addr);
  Rn::Rn(&local_44,ext_00 >> 0xc & 0xf);
  if (((str->style->syntax != GNU) && (str->style->syntax != GNU_MIT)) ||
     (bVar2 = isValidExt(this,CHK2,DIPC,op,ext_00), bVar2)) {
    if ((ext_00 & 0x800) == 0) {
      pSVar3 = StrWriter::operator<<(str);
      pSVar3 = StrWriter::operator<<(pSVar3);
      local_5c = (str->tab).raw;
      pSVar3 = StrWriter::operator<<(pSVar3,(Tab)local_5c);
      pSVar3 = StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)9,_4> *)local_40);
      pSVar3 = StrWriter::operator<<(pSVar3);
      local_64 = local_44.raw;
      StrWriter::operator<<(pSVar3,local_44);
    }
    else {
      pSVar3 = StrWriter::operator<<(str);
      pSVar3 = StrWriter::operator<<(pSVar3);
      local_4c = (str->tab).raw;
      pSVar3 = StrWriter::operator<<(pSVar3,(Tab)local_4c);
      pSVar3 = StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)9,_4> *)local_40);
      pSVar3 = StrWriter::operator<<(pSVar3);
      local_54 = local_44.raw;
      StrWriter::operator<<(pSVar3,local_44);
    }
    local_68.ext1 = 0;
    StrWriter::operator<<(str,&local_68);
  }
  else {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)145,(moira::Mode)9,4>(this,str,addr,op);
  }
  return;
}

Assistant:

void
Moira::dasmChkCmp2(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Rn       ( xxxx____________(ext)      );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {
            
            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    if (ext & 0x0800) {
        str << Ins<Instr::CHK2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    } else {
        str << Ins<Instr::CMP2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    }
    str << Av<I, M, S>{};
}